

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnConvertExpr(BinaryReaderIR *this,Opcode opcode)

{
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)18>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)18>_>_>
  local_28;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  BinaryReaderIR *local_18;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_18 = this;
  this_local._0_4_ = opcode.enum_;
  std::make_unique<wabt::OpcodeExpr<(wabt::ExprType)18>,wabt::Opcode&>((Opcode *)&local_28);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)18>,std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)18>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_20,&local_28);
  this_local._4_4_ = AppendExpr(this,&local_20);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_20);
  std::
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)18>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)18>_>_>
  ::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnConvertExpr(Opcode opcode) {
  return AppendExpr(std::make_unique<ConvertExpr>(opcode));
}